

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O2

int __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *enterTest,bool polish)

{
  undefined1 *a;
  double *pdVar1;
  uint *puVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  Breakpoint *pBVar6;
  pointer pBVar7;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec;
  type_conflict5 tVar9;
  bool bVar10;
  int iVar11;
  pointer pnVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  undefined8 extraout_RDX;
  undefined8 uVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  int *piVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *val_00;
  cpp_dec_float<50U,_int,_void> *result_00;
  int nBp;
  ulong local_738;
  int *local_730;
  int leaveIdx;
  int minIdx;
  uint local_720;
  uint local_71c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_718;
  pointer local_710;
  pointer local_708;
  int32_t local_700;
  fpclass_type local_6fc;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absupd;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  cpp_dec_float<50U,_int,_void> local_678;
  cpp_dec_float<50U,_int,_void> *local_640;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_638;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_630;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_628;
  cpp_dec_float<50U,_int,_void> *local_5f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  SPxId baseId;
  BreakpointCompare local_5a0;
  undefined1 local_598 [8];
  undefined8 uStack_590;
  uint local_588 [3];
  undefined3 uStack_57b;
  uint local_578;
  undefined3 uStack_573;
  int local_570;
  bool local_56c;
  undefined8 local_568;
  uint local_558 [12];
  cpp_dec_float<50U,_int,_void> local_528;
  long local_4f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  stab;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_468;
  multiprecision local_428 [8];
  uint auStack_420 [2];
  uint local_418 [2];
  uint auStack_410 [2];
  uint local_408 [2];
  int local_400;
  undefined1 local_3fc;
  fpclass_type local_3f8;
  int32_t local_3f4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  multiprecision local_368 [8];
  uint auStack_360 [2];
  uint local_358 [2];
  uint auStack_350 [2];
  uint local_348 [2];
  int local_340;
  undefined1 local_33c;
  undefined8 local_338;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  int local_300;
  undefined1 local_2fc;
  undefined8 local_2f8;
  Breakpoint tmp;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  int local_240;
  undefined1 local_23c;
  undefined8 local_238;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  undefined8 local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  if (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .thesolver)->enterCount % 100 == 0) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)
               &(this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).field_0x114,1);
  }
  if ((((!polish) &&
       ((this->
        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).field_0x111 == '\x01')) &&
      ((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).field_0x112 == '\x01')) &&
     (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .thesolver)->theRep != COLUMN)) {
    a = &(this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).field_0x114;
    tmp.val.m_backend.data._M_elems._0_8_ =
         tmp.val.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
    tVar9 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)a,(int *)&tmp);
    if (!tVar9) {
      pSVar3 = (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .thesolver;
      pUVar4 = pSVar3->theFvec;
      pnVar13 = (pUVar4->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar5 = (pUVar4->thedelta).
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_730 = (pUVar4->thedelta).super_IdxSet.idx;
      local_738 = CONCAT44(local_738._4_4_,(pUVar4->thedelta).super_IdxSet.num);
      local_710 = (pSVar3->theUBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_708 = (pSVar3->theLBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      tmp.val.m_backend.fpclass = cpp_dec_float_finite;
      tmp.val.m_backend.prec_elem = 10;
      tmp.val.m_backend.data._M_elems[0] = 0;
      tmp.val.m_backend.data._M_elems[1] = 0;
      tmp.val.m_backend.data._M_elems[2] = 0;
      tmp.val.m_backend.data._M_elems[3] = 0;
      tmp.val.m_backend.data._M_elems[4] = 0;
      tmp.val.m_backend.data._M_elems[5] = 0;
      tmp.val.m_backend.data._M_elems._24_5_ = 0;
      tmp.val.m_backend.data._M_elems[7]._1_3_ = 0;
      tmp.val.m_backend.data._M_elems._32_5_ = 0;
      tmp.val.m_backend._37_8_ = 0;
      local_678.fpclass = cpp_dec_float_finite;
      local_678.prec_elem = 10;
      local_678.data._M_elems[0] = 0;
      local_678.data._M_elems[1] = 0;
      local_678.data._M_elems[2] = 0;
      local_678.data._M_elems[3] = 0;
      leaveIdx = -1;
      local_678.data._M_elems[4] = 0;
      local_678.data._M_elems[5] = 0;
      local_678.data._M_elems._24_5_ = 0;
      local_678.data._M_elems[7]._1_3_ = 0;
      local_678.data._M_elems._32_5_ = 0;
      local_678.data._M_elems[9]._1_3_ = 0;
      local_678.exp = 0;
      local_678.neg = false;
      local_528.fpclass = cpp_dec_float_finite;
      local_528.prec_elem = 10;
      local_528.data._M_elems[0] = 0;
      local_528.data._M_elems[1] = 0;
      local_528.data._M_elems[2] = 0;
      local_528.data._M_elems[3] = 0;
      local_528.data._M_elems[4] = 0;
      local_528.data._M_elems[5] = 0;
      local_528.data._M_elems._24_5_ = 0;
      local_528.data._M_elems[7]._1_3_ = 0;
      local_528.data._M_elems._32_5_ = 0;
      local_528.data._M_elems[9]._1_3_ = 0;
      local_528.exp = 0;
      local_528.neg = false;
      local_558[4] = 0;
      local_558[5] = 0;
      local_558[6] = 0;
      local_558[7] = 0;
      local_558[0] = 0;
      local_558[1] = 0;
      local_558[2] = 0;
      local_558[3] = 0;
      local_558[8] = 0;
      local_558[9] = 0;
      stab.m_backend.fpclass = cpp_dec_float_finite;
      stab.m_backend.prec_elem = 10;
      stab.m_backend.data._M_elems[0] = 0;
      stab.m_backend.data._M_elems[1] = 0;
      stab.m_backend.data._M_elems[2] = 0;
      stab.m_backend.data._M_elems[3] = 0;
      stab.m_backend.data._M_elems[4] = 0;
      stab.m_backend.data._M_elems[5] = 0;
      stab.m_backend.data._M_elems._24_5_ = 0;
      stab.m_backend.data._M_elems[7]._1_3_ = 0;
      stab.m_backend.data._M_elems._32_5_ = 0;
      stab.m_backend.data._M_elems[9]._1_3_ = 0;
      stab.m_backend.exp = 0;
      stab.m_backend.neg = false;
      local_628.m_backend.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8)
      ;
      local_628.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
      local_628.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
      local_628.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4)
      ;
      local_628.m_backend.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6)
      ;
      local_628.m_backend.exp = (val->m_backend).exp;
      local_628.m_backend.neg = (val->m_backend).neg;
      local_628.m_backend.fpclass = (val->m_backend).fpclass;
      local_628.m_backend.prec_elem = (val->m_backend).prec_elem;
      local_718 = val;
      local_5f0 = (cpp_dec_float<50U,_int,_void> *)a;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)val,0.0);
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_678,0.0);
      nBp = 0;
      minIdx = -1;
      local_598 = (undefined1  [8])((ulong)(uint)local_598._4_4_ << 0x20);
      tVar9 = boost::multiprecision::operator>(&local_628,(int *)local_598);
      if (tVar9) {
        collectBreakpointsMax
                  (this,&nBp,&minIdx,local_730,(int)local_738,pnVar5,pnVar13,local_710,local_708,
                   FVEC);
      }
      else {
        collectBreakpointsMin
                  (this,&nBp,&minIdx,local_730,(int)local_738,pnVar5,pnVar13,local_710,local_708,
                   FVEC);
      }
      if (nBp == 0) {
        *(undefined8 *)((local_718->m_backend).data._M_elems + 8) =
             local_628.m_backend.data._M_elems._32_8_;
        *(undefined8 *)((local_718->m_backend).data._M_elems + 4) =
             local_628.m_backend.data._M_elems._16_8_;
        *(undefined8 *)((local_718->m_backend).data._M_elems + 6) =
             local_628.m_backend.data._M_elems._24_8_;
        *(undefined8 *)(local_718->m_backend).data._M_elems =
             local_628.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((local_718->m_backend).data._M_elems + 2) =
             local_628.m_backend.data._M_elems._8_8_;
        (local_718->m_backend).exp = local_628.m_backend.exp;
        (local_718->m_backend).neg = local_628.m_backend.neg;
        (local_718->m_backend).fpclass = local_628.m_backend.fpclass;
        (local_718->m_backend).prec_elem = local_628.m_backend.prec_elem;
        return -1;
      }
      local_638 = pnVar13;
      local_630 = pnVar5;
      Breakpoint::operator=
                (&tmp,(this->breakpoints).data.
                      super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                      ._M_impl.super__Vector_impl_data._M_start + minIdx);
      pBVar6 = (this->breakpoints).data.
               super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      Breakpoint::operator=(pBVar6 + minIdx,pBVar6);
      Breakpoint::operator=
                ((this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start,&tmp);
      local_a8 = *(undefined8 *)(enterTest->m_backend).data._M_elems;
      uStack_a0 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 2);
      local_98 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 4);
      uStack_90 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 6);
      local_88 = *(undefined8 *)((enterTest->m_backend).data._M_elems + 8);
      local_80 = (enterTest->m_backend).exp;
      local_7c = (enterTest->m_backend).neg;
      local_78._0_4_ = (enterTest->m_backend).fpclass;
      local_78._4_4_ = (enterTest->m_backend).prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((type *)local_598,(multiprecision *)&local_a8,arg);
      local_528.data._M_elems._32_5_ = _local_578;
      local_528.data._M_elems[9]._1_3_ = uStack_573;
      local_528.data._M_elems[4] = local_588[0];
      local_528.data._M_elems[5] = local_588[1];
      local_528.data._M_elems._24_5_ = stack0xfffffffffffffa80;
      local_528.data._M_elems[7]._1_3_ = uStack_57b;
      local_528.data._M_elems[0] = local_598._0_4_;
      local_528.data._M_elems[1] = local_598._4_4_;
      local_528.data._M_elems[2] = (uint)uStack_590;
      local_528.data._M_elems[3] = uStack_590._4_4_;
      local_528.exp = local_570;
      local_528.neg = local_56c;
      local_528.fpclass = (fpclass_type)local_568;
      local_528.prec_elem = local_568._4_4_;
      local_598 = (undefined1  [8])((ulong)local_598 & 0xffffffff00000000);
      tVar9 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_528,(int *)local_598);
      if (tVar9) {
        pSVar3 = (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver;
        uVar14 = *(undefined8 *)((pSVar3->instableEnterVal).m_backend.data._M_elems + 8);
        local_528.data._M_elems._32_5_ = SUB85(uVar14,0);
        local_528.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
        local_528.data._M_elems._0_8_ =
             *(undefined8 *)(pSVar3->instableEnterVal).m_backend.data._M_elems;
        local_528.data._M_elems._8_8_ =
             *(undefined8 *)((pSVar3->instableEnterVal).m_backend.data._M_elems + 2);
        local_528.data._M_elems._16_8_ =
             *(undefined8 *)((pSVar3->instableEnterVal).m_backend.data._M_elems + 4);
        uVar14 = *(undefined8 *)((pSVar3->instableEnterVal).m_backend.data._M_elems + 6);
        local_528.data._M_elems._24_5_ = SUB85(uVar14,0);
        local_528.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
        local_528.exp = (pSVar3->instableEnterVal).m_backend.exp;
        local_528.neg = (pSVar3->instableEnterVal).m_backend.neg;
        local_528.fpclass = (pSVar3->instableEnterVal).m_backend.fpclass;
        local_528.prec_elem = (pSVar3->instableEnterVal).m_backend.prec_elem;
      }
      local_720 = 0xffffffff;
      local_5a0.entry =
           (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
      uVar18 = 0;
      piVar15 = (int *)0x38;
      iVar11 = 0;
      while( true ) {
        iVar16 = (int)uVar18;
        if (nBp <= iVar16) break;
        local_598 = (undefined1  [8])((ulong)local_598 & 0xffffffff00000000);
        tVar9 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_528,(int *)local_598);
        if (!tVar9) break;
        if (iVar11 < iVar16) {
          iVar11 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                             ((this->breakpoints).data.
                              super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                              ._M_impl.super__Vector_impl_data._M_start,&local_5a0,iVar11 + 1,nBp,4,
                              0,0,true);
          local_738 = CONCAT44(local_738._4_4_,iVar11);
        }
        else {
          local_738 = CONCAT44(local_738._4_4_,iVar11);
        }
        iVar11 = *(int *)((long)&(((this->breakpoints).data.
                                   super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->val).m_backend +
                         (long)piVar15);
        local_568._0_4_ = cpp_dec_float_finite;
        local_568._4_4_ = 10;
        local_598 = (undefined1  [8])0x0;
        uStack_590._0_4_ = 0;
        uStack_590._4_4_ = 0;
        local_588[0] = 0;
        local_588[1] = 0;
        stack0xfffffffffffffa80 = 0;
        uStack_57b = 0;
        _local_578 = 0;
        uStack_573 = 0;
        local_570 = 0;
        local_56c = false;
        lowstab.m_backend.fpclass = cpp_dec_float_finite;
        lowstab.m_backend.prec_elem = 10;
        lowstab.m_backend.data._M_elems[0] = 0;
        lowstab.m_backend.data._M_elems[1] = 0;
        lowstab.m_backend.data._M_elems[2] = 0;
        lowstab.m_backend.data._M_elems[3] = 0;
        lowstab.m_backend.data._M_elems[4] = 0;
        lowstab.m_backend.data._M_elems[5] = 0;
        lowstab.m_backend.data._M_elems._24_5_ = 0;
        lowstab.m_backend.data._M_elems[7]._1_3_ = 0;
        lowstab.m_backend.data._M_elems._32_5_ = 0;
        lowstab.m_backend.data._M_elems[9]._1_3_ = 0;
        lowstab.m_backend.exp = 0;
        lowstab.m_backend.neg = false;
        local_328 = *(undefined8 *)local_630[iVar11].m_backend.data._M_elems;
        uStack_320 = *(undefined8 *)(local_630[iVar11].m_backend.data._M_elems + 2);
        puVar2 = local_630[iVar11].m_backend.data._M_elems + 4;
        local_318 = *(undefined8 *)puVar2;
        uStack_310 = *(undefined8 *)(puVar2 + 2);
        local_308 = *(undefined8 *)(local_630[iVar11].m_backend.data._M_elems + 8);
        local_300 = local_630[iVar11].m_backend.exp;
        local_2fc = local_630[iVar11].m_backend.neg;
        local_2f8._0_4_ = local_630[iVar11].m_backend.fpclass;
        local_2f8._4_4_ = local_630[iVar11].m_backend.prec_elem;
        local_730 = piVar15;
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((type *)&absupd.m_backend,(multiprecision *)&local_328,local_630);
        pSVar3 = (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver;
        baseId.super_DataKey =
             (pSVar3->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).theBaseId.data[iVar11].super_DataKey;
        iVar11 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::number(&pSVar3->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ,&baseId);
        pSVar3 = (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver;
        pLVar8 = &(pSVar3->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        if (0 < baseId.super_DataKey.info) {
          pLVar8 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)&(pSVar3->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ;
        }
        pnVar12 = (pLVar8->right).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_598 = *(undefined1 (*) [8])&pnVar12[iVar11].m_backend.data;
        uStack_590 = *(double *)((long)&pnVar12[iVar11].m_backend.data + 8);
        puVar2 = (uint *)((long)&pnVar12[iVar11].m_backend.data + 0x10);
        local_588._0_8_ = *(undefined8 *)puVar2;
        uVar14 = *(undefined8 *)(puVar2 + 2);
        stack0xfffffffffffffa80 = (undefined5)uVar14;
        uStack_57b = (undefined3)((ulong)uVar14 >> 0x28);
        uVar14 = *(undefined8 *)((long)&pnVar12[iVar11].m_backend.data + 0x20);
        _local_578 = (undefined5)uVar14;
        uStack_573 = (undefined3)((ulong)uVar14 >> 0x28);
        local_570 = pnVar12[iVar11].m_backend.exp;
        local_56c = pnVar12[iVar11].m_backend.neg;
        local_568._0_4_ = pnVar12[iVar11].m_backend.fpclass;
        local_568._4_4_ = pnVar12[iVar11].m_backend.prec_elem;
        pLVar8 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&(pSVar3->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ;
        if (baseId.super_DataKey.info < 1) {
          pLVar8 = &(pSVar3->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ;
        }
        pnVar12 = (pLVar8->left).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar14 = *(undefined8 *)((long)&pnVar12[iVar11].m_backend.data + 0x20);
        lowstab.m_backend.data._M_elems._32_5_ = SUB85(uVar14,0);
        lowstab.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
        lowstab.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar12[iVar11].m_backend.data;
        lowstab.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&pnVar12[iVar11].m_backend.data + 8);
        puVar2 = (uint *)((long)&pnVar12[iVar11].m_backend.data + 0x10);
        lowstab.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        uVar14 = *(undefined8 *)(puVar2 + 2);
        lowstab.m_backend.data._M_elems._24_5_ = SUB85(uVar14,0);
        lowstab.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
        lowstab.m_backend.exp = pnVar12[iVar11].m_backend.exp;
        lowstab.m_backend.neg = pnVar12[iVar11].m_backend.neg;
        lowstab.m_backend.fpclass = pnVar12[iVar11].m_backend.fpclass;
        lowstab.m_backend.prec_elem = pnVar12[iVar11].m_backend.prec_elem;
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result.m_backend,(cpp_dec_float<50U,_int,_void> *)local_598,&absupd.m_backend);
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems._24_5_ = 0;
        result_1.m_backend.data._M_elems[7]._1_3_ = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_1.m_backend,&lowstab.m_backend,&absupd.m_backend);
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 10;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems._24_5_ = 0;
        result_2.m_backend.data._M_elems[7]._1_3_ = 0;
        result_2.m_backend.data._M_elems._32_5_ = 0;
        result_2.m_backend.data._M_elems[9]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_2.m_backend,&result.m_backend,&result_1.m_backend);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_528,&result_2.m_backend);
        tVar9 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&absupd.m_backend,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_678);
        if (tVar9) {
          local_678.data._M_elems._32_5_ = absupd.m_backend.data._M_elems._32_5_;
          local_678.data._M_elems[9]._1_3_ = absupd.m_backend.data._M_elems[9]._1_3_;
          local_678.data._M_elems[4] = absupd.m_backend.data._M_elems[4];
          local_678.data._M_elems[5] = absupd.m_backend.data._M_elems[5];
          local_678.data._M_elems._24_5_ = absupd.m_backend.data._M_elems._24_5_;
          local_678.data._M_elems[7]._1_3_ = absupd.m_backend.data._M_elems[7]._1_3_;
          local_678.data._M_elems[0] = absupd.m_backend.data._M_elems[0];
          local_678.data._M_elems[1] = absupd.m_backend.data._M_elems[1];
          local_678.data._M_elems[2] = absupd.m_backend.data._M_elems[2];
          local_678.data._M_elems[3] = absupd.m_backend.data._M_elems[3];
          local_678.exp = absupd.m_backend.exp;
          local_678.neg = absupd.m_backend.neg;
          local_678.prec_elem = absupd.m_backend.prec_elem;
          local_678.fpclass = absupd.m_backend.fpclass;
        }
        uVar18 = uVar18 + 1;
        piVar15 = local_730 + 0x10;
        iVar11 = (int)local_738;
      }
      local_71c = (uint)(uVar18 - 1);
      local_640 = &(this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .delta.m_backend;
      tVar9 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_528,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_640);
      if ((!tVar9) || (iVar16 < nBp)) {
        pBVar7 = (this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar14 = *(undefined8 *)((long)((long)&pBVar7[-2].val.m_backend + 0x28U) + (long)piVar15);
        _local_578 = (undefined5)uVar14;
        uStack_573 = (undefined3)((ulong)uVar14 >> 0x28);
        pdVar1 = (double *)((long)((long)&pBVar7[-2].val.m_backend + 8U) + (long)piVar15);
        local_598 = (undefined1  [8])*pdVar1;
        uStack_590 = pdVar1[1];
        puVar2 = (uint *)((long)((long)&pBVar7[-2].val.m_backend + 0x18U) + (long)piVar15);
        local_588._0_8_ = *(undefined8 *)puVar2;
        uVar14 = *(undefined8 *)(puVar2 + 2);
        stack0xfffffffffffffa80 = (undefined5)uVar14;
        uStack_57b = (undefined3)((ulong)uVar14 >> 0x28);
        local_570 = *(int *)((long)((long)&pBVar7[-2].val.m_backend + 0x30U) + (long)piVar15);
        local_56c = *(bool *)((long)((long)&pBVar7[-2].val.m_backend + 0x34U) + (long)piVar15);
        local_568 = *(undefined8 *)((long)&pBVar7[-2].idx + (long)piVar15);
        local_730 = (int *)uVar18;
        local_4f0 = uVar18 - 1;
        for (; (long)uVar18 < (long)nBp; uVar18 = uVar18 + 1) {
          local_738 = uVar18;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&lowstab.m_backend,0,(type *)0x0);
          uVar14 = extraout_RDX;
          if ((long)iVar11 <= (long)(uVar18 - 1)) {
            uVar14 = 0;
            iVar11 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                               ((this->breakpoints).data.
                                super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                ._M_impl.super__Vector_impl_data._M_start,&local_5a0,iVar11 + 1,nBp,
                                4,0,0,true);
          }
          iVar16 = *(int *)((long)&(((this->breakpoints).data.
                                     super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->val).m_backend +
                           (long)piVar15);
          absupd.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)(local_630[iVar16].m_backend.data._M_elems + 8);
          absupd.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)local_630[iVar16].m_backend.data._M_elems;
          absupd.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)(local_630[iVar16].m_backend.data._M_elems + 2);
          puVar2 = local_630[iVar16].m_backend.data._M_elems + 4;
          absupd.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          absupd.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          absupd.m_backend.exp = local_630[iVar16].m_backend.exp;
          absupd.m_backend.neg = local_630[iVar16].m_backend.neg;
          absupd.m_backend.fpclass = local_630[iVar16].m_backend.fpclass;
          absupd.m_backend.prec_elem = local_630[iVar16].m_backend.prec_elem;
          local_428 = (multiprecision  [8])absupd.m_backend.data._M_elems._0_8_;
          auStack_420 = (uint  [2])absupd.m_backend.data._M_elems._8_8_;
          local_418 = (uint  [2])absupd.m_backend.data._M_elems._16_8_;
          auStack_410 = (uint  [2])absupd.m_backend.data._M_elems._24_8_;
          local_408 = (uint  [2])absupd.m_backend.data._M_elems._32_8_;
          local_400 = absupd.m_backend.exp;
          local_3fc = absupd.m_backend.neg;
          local_3f8 = absupd.m_backend.fpclass;
          local_3f4 = absupd.m_backend.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((type *)&result_2.m_backend,local_428,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT71((int7)((ulong)uVar14 >> 8),absupd.m_backend.neg));
          tVar9 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_2.m_backend,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_678);
          if (tVar9) {
            result_2.m_backend.data._M_elems[0] = 0;
            result_2.m_backend.data._M_elems[1] = 0;
            tVar9 = boost::multiprecision::operator>(&absupd,(double *)&result_2.m_backend);
            pnVar12 = local_708;
            if (tVar9) {
              pnVar12 = local_710;
            }
            lowstab.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)pnVar12[iVar16].m_backend.data._M_elems;
            lowstab.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)(pnVar12[iVar16].m_backend.data._M_elems + 2);
            puVar2 = pnVar12[iVar16].m_backend.data._M_elems + 4;
            lowstab.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            uVar14 = *(undefined8 *)(puVar2 + 2);
            lowstab.m_backend.data._M_elems._24_5_ = SUB85(uVar14,0);
            lowstab.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            uVar14 = *(undefined8 *)(pnVar12[iVar16].m_backend.data._M_elems + 8);
            lowstab.m_backend.data._M_elems._32_5_ = SUB85(uVar14,0);
            lowstab.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            lowstab.m_backend.exp = pnVar12[iVar16].m_backend.exp;
            lowstab.m_backend.neg = pnVar12[iVar16].m_backend.neg;
            lowstab.m_backend.fpclass = pnVar12[iVar16].m_backend.fpclass;
            lowstab.m_backend.prec_elem = pnVar12[iVar16].m_backend.prec_elem;
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result.m_backend,&lowstab.m_backend,&local_638[iVar16].m_backend);
            result_2.m_backend.fpclass = cpp_dec_float_finite;
            result_2.m_backend.prec_elem = 10;
            result_2.m_backend.data._M_elems[0] = 0;
            result_2.m_backend.data._M_elems[1] = 0;
            result_2.m_backend.data._M_elems[2] = 0;
            result_2.m_backend.data._M_elems[3] = 0;
            result_2.m_backend.data._M_elems[4] = 0;
            result_2.m_backend.data._M_elems[5] = 0;
            result_2.m_backend.data._M_elems._24_5_ = 0;
            result_2.m_backend.data._M_elems[7]._1_3_ = 0;
            result_2.m_backend.data._M_elems._32_5_ = 0;
            result_2.m_backend.data._M_elems[9]._1_3_ = 0;
            result_2.m_backend.exp = 0;
            result_2.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_2.m_backend,&result.m_backend,&absupd.m_backend);
            lowstab.m_backend.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
            lowstab.m_backend.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
            lowstab.m_backend.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
            lowstab.m_backend.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
            lowstab.m_backend.data._M_elems._24_5_ = result_2.m_backend.data._M_elems._24_5_;
            lowstab.m_backend.data._M_elems[7]._1_3_ = result_2.m_backend.data._M_elems[7]._1_3_;
            lowstab.m_backend.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
            lowstab.m_backend.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
            lowstab.m_backend.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
            lowstab.m_backend.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
            lowstab.m_backend.exp = result_2.m_backend.exp;
            lowstab.m_backend.neg = result_2.m_backend.neg;
            lowstab.m_backend.fpclass = result_2.m_backend.fpclass;
            lowstab.m_backend.prec_elem = result_2.m_backend.prec_elem;
            tVar9 = boost::multiprecision::operator<=
                              (&lowstab,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)local_598);
            uVar18 = local_738;
            if (tVar9) {
              local_368 = (multiprecision  [8])absupd.m_backend.data._M_elems._0_8_;
              auStack_360[0] = absupd.m_backend.data._M_elems[2];
              auStack_360[1] = absupd.m_backend.data._M_elems[3];
              local_358[0] = absupd.m_backend.data._M_elems[4];
              local_358[1] = absupd.m_backend.data._M_elems[5];
              auStack_350[0] = absupd.m_backend.data._M_elems[6];
              auStack_350[1] = absupd.m_backend.data._M_elems[7];
              local_348[0] = absupd.m_backend.data._M_elems[8];
              local_348[1] = absupd.m_backend.data._M_elems[9];
              local_340 = absupd.m_backend.exp;
              local_33c = absupd.m_backend.neg;
              local_338 = CONCAT44(absupd.m_backend.prec_elem,absupd.m_backend.fpclass);
              boost::multiprecision::
              abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        ((type *)&result_2.m_backend,local_368,arg_00);
              local_678.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
              local_678.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
              local_678.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
              local_678.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
              local_678.data._M_elems._24_5_ = result_2.m_backend.data._M_elems._24_5_;
              local_678.data._M_elems[7]._1_3_ = result_2.m_backend.data._M_elems[7]._1_3_;
              local_678.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
              local_678.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
              local_678.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
              local_678.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
              local_678.exp = result_2.m_backend.exp;
              local_678.neg = result_2.m_backend.neg;
              local_678.fpclass = result_2.m_backend.fpclass;
              local_678.prec_elem = result_2.m_backend.prec_elem;
              local_720 = (uint)uVar18;
            }
          }
          else {
            result_2.m_backend.fpclass = cpp_dec_float_finite;
            result_2.m_backend.prec_elem = 10;
            result_2.m_backend.data._M_elems[0] = 0;
            result_2.m_backend.data._M_elems[1] = 0;
            result_2.m_backend.data._M_elems[2] = 0;
            result_2.m_backend.data._M_elems[3] = 0;
            result_2.m_backend.data._M_elems[4] = 0;
            result_2.m_backend.data._M_elems[5] = 0;
            result_2.m_backend.data._M_elems._24_5_ = 0;
            result_2.m_backend.data._M_elems[7]._1_3_ = 0;
            result_2.m_backend.data._M_elems._32_5_ = 0;
            result_2.m_backend.data._M_elems[9]._1_3_ = 0;
            result_2.m_backend.exp = 0;
            result_2.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_2.m_backend,local_640,(cpp_dec_float<50U,_int,_void> *)local_598);
            tVar9 = boost::multiprecision::operator>
                              (&lowstab,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&result_2.m_backend);
            uVar18 = local_738;
            if (tVar9) break;
          }
          piVar15 = piVar15 + 0x10;
        }
        pnVar13 = &(this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta;
        lowstab.m_backend.fpclass = cpp_dec_float_finite;
        lowstab.m_backend.prec_elem = 10;
        lowstab.m_backend.data._M_elems[0] = 0;
        lowstab.m_backend.data._M_elems[1] = 0;
        lowstab.m_backend.data._M_elems[2] = 0;
        lowstab.m_backend.data._M_elems[3] = 0;
        lowstab.m_backend.data._M_elems[4] = 0;
        lowstab.m_backend.data._M_elems[5] = 0;
        lowstab.m_backend.data._M_elems._24_5_ = 0;
        lowstab.m_backend.data._M_elems[7]._1_3_ = 0;
        lowstab.m_backend.data._M_elems._32_5_ = 0;
        lowstab.m_backend.data._M_elems[9]._1_3_ = 0;
        lowstab.m_backend.exp = 0;
        lowstab.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&lowstab.m_backend,&pnVar13->m_backend,&local_678);
        local_558[9]._1_3_ = lowstab.m_backend.data._M_elems[9]._1_3_;
        local_558._32_5_ = lowstab.m_backend.data._M_elems._32_5_;
        local_558[7]._1_3_ = lowstab.m_backend.data._M_elems[7]._1_3_;
        local_558._24_5_ = lowstab.m_backend.data._M_elems._24_5_;
        local_558[4] = lowstab.m_backend.data._M_elems[4];
        local_558[5] = lowstab.m_backend.data._M_elems[5];
        local_558[0] = lowstab.m_backend.data._M_elems[0];
        local_558[1] = lowstab.m_backend.data._M_elems[1];
        local_558[2] = lowstab.m_backend.data._M_elems[2];
        local_558[3] = lowstab.m_backend.data._M_elems[3];
        local_738 = CONCAT44(local_738._4_4_,lowstab.m_backend.exp);
        local_640 = (cpp_dec_float<50U,_int,_void> *)CONCAT71(local_640._1_7_,lowstab.m_backend.neg)
        ;
        local_6fc = lowstab.m_backend.fpclass;
        local_700 = lowstab.m_backend.prec_elem;
        bVar10 = ((this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver)->instableEnter;
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&absupd,
                   &(this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)
        ;
        uVar18 = -(ulong)(*(double *)(absupd.m_backend.data._M_elems._0_8_ + 0x40) == 1.0);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&lowstab.m_backend,
                   (double)(~uVar18 & (ulong)(*(double *)
                                               (absupd.m_backend.data._M_elems._0_8_ + 0x40) * 1e-10
                                             ) | uVar18 & 0x3ddb7cdfd9d7bdbb),(type *)0x0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (absupd.m_backend.data._M_elems + 2));
        if (bVar10 == false) {
          local_128.m_backend.data._M_elems[9]._1_3_ = local_678.data._M_elems[9]._1_3_;
          local_128.m_backend.data._M_elems._32_5_ = local_678.data._M_elems._32_5_;
          local_128.m_backend.data._M_elems[7]._1_3_ = local_678.data._M_elems[7]._1_3_;
          local_128.m_backend.data._M_elems._24_5_ = local_678.data._M_elems._24_5_;
          local_128.m_backend.data._M_elems[4] = local_678.data._M_elems[4];
          local_128.m_backend.data._M_elems[5] = local_678.data._M_elems[5];
          local_128.m_backend.data._M_elems[0] = local_678.data._M_elems[0];
          local_128.m_backend.data._M_elems[1] = local_678.data._M_elems[1];
          local_128.m_backend.data._M_elems[2] = local_678.data._M_elems[2];
          local_128.m_backend.data._M_elems[3] = local_678.data._M_elems[3];
          local_128.m_backend.exp = local_678.exp;
          local_128.m_backend.neg = local_678.neg;
          local_128.m_backend.fpclass = local_678.fpclass;
          local_128.m_backend.prec_elem = local_678.prec_elem;
          SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::minStability(&absupd,&this->
                                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ,&local_128);
          pnVar5 = &absupd;
        }
        else {
          absupd.m_backend.data._M_elems[9]._1_3_ = lowstab.m_backend.data._M_elems[9]._1_3_;
          absupd.m_backend.data._M_elems._32_5_ = lowstab.m_backend.data._M_elems._32_5_;
          absupd.m_backend.data._M_elems[7]._1_3_ = lowstab.m_backend.data._M_elems[7]._1_3_;
          absupd.m_backend.data._M_elems._24_5_ = lowstab.m_backend.data._M_elems._24_5_;
          absupd.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
          absupd.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
          absupd.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
          absupd.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
          absupd.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
          absupd.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
          absupd.m_backend.exp = lowstab.m_backend.exp;
          absupd.m_backend.neg = lowstab.m_backend.neg;
          absupd.m_backend.fpclass = lowstab.m_backend.fpclass;
          pnVar5 = &lowstab;
        }
        vec = local_638;
        val_00 = local_718;
        stab.m_backend.data._M_elems._32_5_ = absupd.m_backend.data._M_elems._32_5_;
        stab.m_backend.data._M_elems[9]._1_3_ = absupd.m_backend.data._M_elems[9]._1_3_;
        stab.m_backend.data._M_elems[4] = absupd.m_backend.data._M_elems[4];
        stab.m_backend.data._M_elems[5] = absupd.m_backend.data._M_elems[5];
        stab.m_backend.data._M_elems._24_5_ = absupd.m_backend.data._M_elems._24_5_;
        stab.m_backend.data._M_elems[7]._1_3_ = absupd.m_backend.data._M_elems[7]._1_3_;
        stab.m_backend.data._M_elems[0] = absupd.m_backend.data._M_elems[0];
        stab.m_backend.data._M_elems[1] = absupd.m_backend.data._M_elems[1];
        stab.m_backend.data._M_elems[2] = absupd.m_backend.data._M_elems[2];
        stab.m_backend.data._M_elems[3] = absupd.m_backend.data._M_elems[3];
        stab.m_backend.prec_elem = (pnVar5->m_backend).prec_elem;
        stab.m_backend.fpclass = absupd.m_backend.fpclass;
        stab.m_backend.exp = absupd.m_backend.exp;
        stab.m_backend.neg = absupd.m_backend.neg;
        if ((int)local_720 < 0) {
          bVar10 = false;
          while ((uVar17 = (uint)local_730, bVar10 == false &&
                 (uVar19 = uVar17 - 1, -1 < (int)uVar19))) {
            iVar11 = (this->breakpoints).data.
                     super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar19].idx;
            if (iVar11 < 0) {
              bVar10 = false;
            }
            else {
              local_3a8.m_backend.data._M_elems[9]._1_3_ = local_678.data._M_elems[9]._1_3_;
              local_3a8.m_backend.data._M_elems._32_5_ = local_678.data._M_elems._32_5_;
              local_3a8.m_backend.data._M_elems[7]._1_3_ = local_678.data._M_elems[7]._1_3_;
              local_3a8.m_backend.data._M_elems._24_5_ = local_678.data._M_elems._24_5_;
              local_3a8.m_backend.data._M_elems[4] = local_678.data._M_elems[4];
              local_3a8.m_backend.data._M_elems[5] = local_678.data._M_elems[5];
              local_3a8.m_backend.data._M_elems[0] = local_678.data._M_elems[0];
              local_3a8.m_backend.data._M_elems[1] = local_678.data._M_elems[1];
              local_3a8.m_backend.data._M_elems[2] = local_678.data._M_elems[2];
              local_3a8.m_backend.data._M_elems[3] = local_678.data._M_elems[3];
              local_3a8.m_backend.exp = local_678.exp;
              local_3a8.m_backend.neg = local_678.neg;
              local_3a8.m_backend.fpclass = local_678.fpclass;
              local_3a8.m_backend.prec_elem = local_678.prec_elem;
              local_468.m_backend.data._M_elems[0] = local_558[0];
              local_468.m_backend.data._M_elems[1] = local_558[1];
              local_468.m_backend.data._M_elems[2] = local_558[2];
              local_468.m_backend.data._M_elems[3] = local_558[3];
              local_468.m_backend.data._M_elems[4] = local_558[4];
              local_468.m_backend.data._M_elems[5] = local_558[5];
              local_468.m_backend.data._M_elems[6] = local_558[6];
              local_468.m_backend.data._M_elems[7] = local_558[7];
              local_468.m_backend.data._M_elems[8] = local_558[8];
              local_468.m_backend.data._M_elems[9] = local_558[9];
              local_468.m_backend.exp = (int)local_738;
              local_468.m_backend.neg = (bool)local_640._0_1_;
              local_468.m_backend.fpclass = local_6fc;
              local_468.m_backend.prec_elem = local_700;
              local_3e8.m_backend.data._M_elems[0] = local_628.m_backend.data._M_elems[0];
              local_3e8.m_backend.data._M_elems[1] = local_628.m_backend.data._M_elems[1];
              local_3e8.m_backend.data._M_elems[2] = local_628.m_backend.data._M_elems[2];
              local_3e8.m_backend.data._M_elems[3] = local_628.m_backend.data._M_elems[3];
              local_3e8.m_backend.data._M_elems[4] = local_628.m_backend.data._M_elems[4];
              local_3e8.m_backend.data._M_elems[5] = local_628.m_backend.data._M_elems[5];
              local_3e8.m_backend.data._M_elems[6] = local_628.m_backend.data._M_elems[6];
              local_3e8.m_backend.data._M_elems[7] = local_628.m_backend.data._M_elems[7];
              local_3e8.m_backend.data._M_elems[8] = local_628.m_backend.data._M_elems[8];
              local_3e8.m_backend.data._M_elems[9] = local_628.m_backend.data._M_elems[9];
              local_3e8.m_backend.exp = local_628.m_backend.exp;
              local_3e8.m_backend.neg = local_628.m_backend.neg;
              local_3e8.m_backend.fpclass = local_628.m_backend.fpclass;
              local_3e8.m_backend.prec_elem = local_628.m_backend.prec_elem;
              bVar10 = getData(this,local_718,&leaveIdx,iVar11,&local_3a8,&local_468,local_630,
                               local_638,local_708,local_710,FVEC,&local_3e8);
            }
            local_71c = (int)local_730 - 2;
            local_730 = (int *)(ulong)uVar19;
          }
          val_00 = local_718;
          local_71c = uVar17;
          if (bVar10 == false) goto LAB_0024b17a;
        }
        else {
          tVar9 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_678,&stab);
          if (!tVar9) {
LAB_0024b17a:
            if (1 < this->relax_count) {
              return leaveIdx;
            }
            SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::relax(&this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
            this->relax_count = this->relax_count + 1;
            *(undefined8 *)((val_00->m_backend).data._M_elems + 8) =
                 local_628.m_backend.data._M_elems._32_8_;
            *(undefined8 *)((val_00->m_backend).data._M_elems + 4) =
                 local_628.m_backend.data._M_elems._16_8_;
            *(undefined8 *)((val_00->m_backend).data._M_elems + 6) =
                 local_628.m_backend.data._M_elems._24_8_;
            *(undefined8 *)(val_00->m_backend).data._M_elems =
                 local_628.m_backend.data._M_elems._0_8_;
            *(undefined8 *)((val_00->m_backend).data._M_elems + 2) =
                 local_628.m_backend.data._M_elems._8_8_;
            (val_00->m_backend).exp = local_628.m_backend.exp;
            (val_00->m_backend).neg = local_628.m_backend.neg;
            (val_00->m_backend).fpclass = local_628.m_backend.fpclass;
            (val_00->m_backend).prec_elem = local_628.m_backend.prec_elem;
            local_228.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((enterTest->m_backend).data._M_elems + 8);
            local_228.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)(enterTest->m_backend).data._M_elems;
            local_228.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)((enterTest->m_backend).data._M_elems + 2);
            local_228.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)((enterTest->m_backend).data._M_elems + 4);
            local_228.m_backend.data._M_elems._24_8_ =
                 *(undefined8 *)((enterTest->m_backend).data._M_elems + 6);
            local_228.m_backend.exp = (enterTest->m_backend).exp;
            local_228.m_backend.neg = (enterTest->m_backend).neg;
            local_228.m_backend.fpclass = (enterTest->m_backend).fpclass;
            local_228.m_backend.prec_elem = (enterTest->m_backend).prec_elem;
            iVar11 = selectLeave(this,val_00,&local_228,false);
            return iVar11;
          }
          local_168.m_backend.data._M_elems[9]._1_3_ = local_678.data._M_elems[9]._1_3_;
          local_168.m_backend.data._M_elems._32_5_ = local_678.data._M_elems._32_5_;
          local_168.m_backend.data._M_elems[7]._1_3_ = local_678.data._M_elems[7]._1_3_;
          local_168.m_backend.data._M_elems._24_5_ = local_678.data._M_elems._24_5_;
          local_168.m_backend.data._M_elems[4] = local_678.data._M_elems[4];
          local_168.m_backend.data._M_elems[5] = local_678.data._M_elems[5];
          local_168.m_backend.data._M_elems[0] = local_678.data._M_elems[0];
          local_168.m_backend.data._M_elems[1] = local_678.data._M_elems[1];
          local_168.m_backend.data._M_elems[2] = local_678.data._M_elems[2];
          local_168.m_backend.data._M_elems[3] = local_678.data._M_elems[3];
          local_168.m_backend.exp = local_678.exp;
          local_168.m_backend.neg = local_678.neg;
          local_168.m_backend.fpclass = local_678.fpclass;
          local_168.m_backend.prec_elem = local_678.prec_elem;
          local_1a8.m_backend.data._M_elems[0] = local_558[0];
          local_1a8.m_backend.data._M_elems[1] = local_558[1];
          local_1a8.m_backend.data._M_elems[2] = local_558[2];
          local_1a8.m_backend.data._M_elems[3] = local_558[3];
          local_1a8.m_backend.data._M_elems[4] = local_558[4];
          local_1a8.m_backend.data._M_elems[5] = local_558[5];
          local_1a8.m_backend.data._M_elems[6] = local_558[6];
          local_1a8.m_backend.data._M_elems[7] = local_558[7];
          local_1a8.m_backend.data._M_elems[8] = local_558[8];
          local_1a8.m_backend.data._M_elems[9] = local_558[9];
          local_1a8.m_backend.exp = (int)local_738;
          local_1a8.m_backend.neg = (bool)local_640._0_1_;
          local_1a8.m_backend.fpclass = local_6fc;
          local_1a8.m_backend.prec_elem = local_700;
          local_1e8.m_backend.data._M_elems[0] = local_628.m_backend.data._M_elems[0];
          local_1e8.m_backend.data._M_elems[1] = local_628.m_backend.data._M_elems[1];
          local_1e8.m_backend.data._M_elems[2] = local_628.m_backend.data._M_elems[2];
          local_1e8.m_backend.data._M_elems[3] = local_628.m_backend.data._M_elems[3];
          local_1e8.m_backend.data._M_elems[4] = local_628.m_backend.data._M_elems[4];
          local_1e8.m_backend.data._M_elems[5] = local_628.m_backend.data._M_elems[5];
          local_1e8.m_backend.data._M_elems[6] = local_628.m_backend.data._M_elems[6];
          local_1e8.m_backend.data._M_elems[7] = local_628.m_backend.data._M_elems[7];
          local_1e8.m_backend.data._M_elems[8] = local_628.m_backend.data._M_elems[8];
          local_1e8.m_backend.data._M_elems[9] = local_628.m_backend.data._M_elems[9];
          local_1e8.m_backend.exp = local_628.m_backend.exp;
          local_1e8.m_backend.neg = local_628.m_backend.neg;
          local_1e8.m_backend.fpclass = local_628.m_backend.fpclass;
          local_1e8.m_backend.prec_elem = local_628.m_backend.prec_elem;
          bVar10 = getData(this,val_00,&leaveIdx,
                           (this->breakpoints).data.
                           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_720].idx,&local_168,
                           &local_1a8,local_630,vec,local_708,local_710,FVEC,&local_1e8);
          if (!bVar10) goto LAB_0024b17a;
          uVar17 = (uint)local_4f0;
        }
        this->relax_count = 0;
        SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tighten(&this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 );
        if (0 < (int)uVar17) {
          pBVar7 = (this->breakpoints).data.
                   super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_248 = *(undefined8 *)((long)&pBVar7[uVar17].val.m_backend + 0x20);
          local_268 = *(undefined8 *)&pBVar7[uVar17].val.m_backend;
          uStack_260 = *(undefined8 *)((long)&pBVar7[uVar17].val.m_backend + 8);
          puVar2 = (uint *)((long)&pBVar7[uVar17].val.m_backend + 0x10);
          local_258 = *(undefined8 *)puVar2;
          uStack_250 = *(undefined8 *)(puVar2 + 2);
          local_240 = *(int *)((long)&pBVar7[uVar17].val.m_backend + 0x28);
          local_23c = *(bool *)((long)&pBVar7[uVar17].val.m_backend + 0x2c);
          local_238 = *(undefined8 *)((long)&pBVar7[uVar17].val.m_backend + 0x30);
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&absupd,(multiprecision *)&local_268,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)CONCAT31((int3)((uint)local_240 >> 8),local_23c));
          tVar9 = boost::multiprecision::operator>(&absupd,pnVar13);
          result_00 = local_5f0;
          if (tVar9) {
            flipAndUpdate(this,(int *)&local_71c);
            ((this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .thesolver)->boundflips = local_71c;
            if (9 < (int)local_71c) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(result_00,1)
              ;
              return leaveIdx;
            }
            absupd.m_backend.data._M_elems[0] = 0x9999999a;
            absupd.m_backend.data._M_elems[1] = 0x3fa99999;
            goto LAB_0024b24d;
          }
        }
        ((this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .thesolver)->boundflips = 0;
        absupd.m_backend.data._M_elems[0] = 0x9999999a;
        absupd.m_backend.data._M_elems[1] = 0x3fb99999;
        result_00 = local_5f0;
LAB_0024b24d:
        boost::multiprecision::default_ops::
        eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                  (result_00,(double *)&absupd);
        return leaveIdx;
      }
      local_598 = (undefined1  [8])0x3fe0000000000000;
      boost::multiprecision::default_ops::
      eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                (local_5f0,(double *)local_598);
      *(undefined8 *)((local_718->m_backend).data._M_elems + 8) =
           local_628.m_backend.data._M_elems._32_8_;
      *(undefined8 *)((local_718->m_backend).data._M_elems + 4) =
           local_628.m_backend.data._M_elems._16_8_;
      *(undefined8 *)((local_718->m_backend).data._M_elems + 6) =
           local_628.m_backend.data._M_elems._24_8_;
      *(undefined8 *)(local_718->m_backend).data._M_elems = local_628.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((local_718->m_backend).data._M_elems + 2) =
           local_628.m_backend.data._M_elems._8_8_;
      (local_718->m_backend).exp = local_628.m_backend.exp;
      (local_718->m_backend).neg = local_628.m_backend.neg;
      (local_718->m_backend).fpclass = local_628.m_backend.fpclass;
      (local_718->m_backend).prec_elem = local_628.m_backend.prec_elem;
      local_e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((enterTest->m_backend).data._M_elems + 8);
      pnVar13 = &local_e8;
      local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterTest->m_backend).data._M_elems;
      local_e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((enterTest->m_backend).data._M_elems + 2);
      local_e8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((enterTest->m_backend).data._M_elems + 4);
      local_e8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((enterTest->m_backend).data._M_elems + 6);
      local_e8.m_backend.exp = (enterTest->m_backend).exp;
      local_e8.m_backend.neg = (enterTest->m_backend).neg;
      local_e8.m_backend.fpclass = (enterTest->m_backend).fpclass;
      local_e8.m_backend.prec_elem = (enterTest->m_backend).prec_elem;
      polish = false;
      val = local_718;
      goto LAB_00249f25;
    }
  }
  local_68.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((enterTest->m_backend).data._M_elems + 8);
  pnVar13 = &local_68;
  local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)(enterTest->m_backend).data._M_elems;
  local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)((enterTest->m_backend).data._M_elems + 2)
  ;
  local_68.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((enterTest->m_backend).data._M_elems + 4);
  local_68.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((enterTest->m_backend).data._M_elems + 6);
  local_68.m_backend.exp = (enterTest->m_backend).exp;
  local_68.m_backend.neg = (enterTest->m_backend).neg;
  local_68.m_backend.fpclass = (enterTest->m_backend).fpclass;
  local_68.m_backend.prec_elem = (enterTest->m_backend).prec_elem;
LAB_00249f25:
  iVar11 = SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::selectLeave(&this->
                          super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ,val,pnVar13,polish);
  return iVar11;
}

Assistant:

int SPxBoundFlippingRT<R>::selectLeave(
   R&                 val,
   R                  enterTest,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::ENTER);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->enterCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DEBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(polish || !enableBoundFlips || !enableRowBoundFlips
         || this->thesolver->rep() == SPxSolverBase<R>::COLUMN || flipPotential <= 0)
   {
      SPxOut::debug(this, "DEBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectLeave(val, enterTest, polish);
   }

   const R*  vec =
      this->thesolver->fVec().get_const_ptr();         /**< pointer to values of current VectorBase<R> */
   const R*  upd =
      this->thesolver->fVec().delta().values();        /**< pointer to update values of current VectorBase<R> */
   const int*   idx =
      this->thesolver->fVec().delta().indexMem();      /**< pointer to indices of current VectorBase<R> */
   int          updnnz =
      this->thesolver->fVec().delta().size();       /**< number of nonzeros in update VectorBase<R> */
   const R*  lb  =
      this->thesolver->lbBound().get_const_ptr();      /**< pointer to lower bound/lhs of current VectorBase<R> */
   const R*  ub  =
      this->thesolver->ubBound().get_const_ptr();      /**< pointer to upper bound/rhs of current VectorBase<R> */

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid leaving index
   int leaveIdx = -1;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   assert(this->thesolver->fVec().delta().isSetup());

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, idx, updnnz, upd, vec, ub, lb, FVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, idx, updnnz, upd, vec, ub, lb, FVEC);
   }

   // return -1 if no BP was found
   if(nBp == 0)
   {
      val = max;
      return leaveIdx;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(enterTest);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableEnterId.isValid());
      // restore original slope
      slope = this->thesolver->instableEnterVal;
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      assert(breakpoints[npassedBp].src == FVEC);
      int breakpointidx = breakpoints[npassedBp].idx;
      // compute new slope
      R upper;
      R lower;
      R absupd = spxAbs(upd[breakpointidx]);
      SPxId baseId = this->thesolver->baseId(breakpointidx);
      int i = this->thesolver->number(baseId);

      if(baseId.isSPxColId())
      {
         upper = this->thesolver->upper(i);
         lower = this->thesolver->lower(i);
      }
      else
      {
         assert(baseId.isSPxRowId());
         upper = this->thesolver->rhs(i);
         lower = this->thesolver->lhs(i);
      }

      slope -= (upper * absupd) - (lower * absupd);

      // get most stable pivot
      if(absupd > moststable)
         moststable = absupd;
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DEBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectLeave(val, enterTest);
   }

   SPxOut::debug(this, "DEBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int breakpointidx = breakpoints[stableBp].idx;
      assert(breakpoints[stableBp].src == FVEC);
      R x = upd[breakpointidx];

      if(spxAbs(x) > moststable)
      {
         stableDelta = (x > 0.0) ? ub[breakpointidx] : lb[breakpointidx];
         stableDelta = (stableDelta - vec[breakpointidx]) / x;

         if(stableDelta <= bestDelta)
         {
            moststable = spxAbs(x);
            bestBp = stableBp;
         }
      }
      // stop searching if the step length is too big
      else if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableEnter;
   assert(!instable || this->thesolver->instableEnterId.isValid());
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int breakpointidx = breakpoints[bestBp].idx;
         assert(breakpointidx >= 0);
         foundStable = getData(val, leaveIdx, breakpointidx, moststable, degeneps, upd, vec, lb, ub, FVEC,
                               max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int breakpointidx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(breakpointidx >= 0)
         {
            foundStable = getData(val, leaveIdx, breakpointidx, moststable, degeneps, upd, vec, lb, ub, FVEC,
                                  max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(leaveIdx < 0);

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DEBFRT04 {}: no valid leaveIdx found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectLeave(val, enterTest);
      }
      else
      {
         SPxOut::debug(this, "DEBFRT05 {}: no valid leaveIdx found - breaking...\n",
                       this->thesolver->basis().iteration());
         return leaveIdx;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DEBFRT06 {}: selected Index: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), leaveIdx, nBp);

   return leaveIdx;
}